

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

size_type anon_unknown.dwarf_14c2e::root_directory_start(string_type *path,size_type size)

{
  char *pcVar1;
  ulong uVar2;
  
  if (size == 2) {
    pcVar1 = (path->_M_dataplus)._M_p;
    if ((*pcVar1 == '/') && (pcVar1[1] != '/')) {
      return 0;
    }
  }
  else if (size < 4) {
    if ((size != 0) && (*(path->_M_dataplus)._M_p == '/')) {
      return 0;
    }
  }
  else {
    pcVar1 = (path->_M_dataplus)._M_p;
    if (*pcVar1 == '/') {
      if ((pcVar1[1] == '/') && (pcVar1[2] != '/')) {
        uVar2 = std::__cxx11::string::find_first_of((char *)path,0x11301d);
        if (uVar2 < size) {
          return uVar2;
        }
        return 0xffffffffffffffff;
      }
      return 0;
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

size_type root_directory_start(const string_type & path, size_type size)
  // return npos if no root_directory found
  {

#   ifdef BOOST_WINDOWS_API
    // case "c:/"
    if (size > 2
      && path[1] == colon
      && is_separator(path[2])) return 2;
#   endif

    // case "//"
    if (size == 2
      && is_separator(path[0])
      && is_separator(path[1])) return string_type::npos;

#   ifdef BOOST_WINDOWS_API
    // case "\\?\"
    if (size > 4
      && is_separator(path[0])
      && is_separator(path[1])
      && path[2] == questionmark
      && is_separator(path[3]))
    {
      string_type::size_type pos(path.find_first_of(separators, 4));
        return pos < size ? pos : string_type::npos;
    }
#   endif

    // case "//net {/}"
    if (size > 3
      && is_separator(path[0])
      && is_separator(path[1])
      && !is_separator(path[2]))
    {
      string_type::size_type pos(path.find_first_of(separators, 2));
      return pos < size ? pos : string_type::npos;
    }
    
    // case "/"
    if (size > 0 && is_separator(path[0])) return 0;

    return string_type::npos;
  }